

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O2

bool __thiscall ki::protocol::net::ServerSession::is_alive(ServerSession *this)

{
  long lVar1;
  undefined1 *puVar2;
  long lVar3;
  
  lVar3 = 7000000000;
  puVar2 = &this->field_0x10;
  if ((&this->field_0xa)[(long)this->_vptr_ServerSession[-3]] != '\0') {
    lVar3 = 21000000000;
    puVar2 = &this->field_0x28;
  }
  lVar1 = std::chrono::_V2::steady_clock::now();
  return lVar1 - *(long *)(puVar2 + (long)this->_vptr_ServerSession[-3]) < lVar3;
}

Assistant:

bool ServerSession::is_alive() const
	{
		// If the session isn't established yet, use the time of
		// creation to decide whether this session is alive.
		if (!m_established)
			return std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_creation_time
			).count() <= (KI_CONNECTION_TIMEOUT * 2);

		// Otherwise, use the last time we received a heartbeat.
		return std::chrono::duration_cast<std::chrono::seconds>(
			std::chrono::steady_clock::now() - m_last_received_heartbeat_time
		).count() <= (KI_CLIENT_HEARTBEAT * 2);
	}